

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_mfiles.c
# Opt level: O0

multi_files *
AddMultiFiles(char *file_name,char *type_name,char *show_filename,multi_files **multi_first,
             multi_files **multi_last)

{
  multi_files *pmVar1;
  multi_files *multi_name;
  multi_files *multi_type;
  multi_files *multi;
  multi_files **multi_last_local;
  multi_files **multi_first_local;
  char *show_filename_local;
  char *type_name_local;
  char *file_name_local;
  
  pmVar1 = (multi_files *)calloc(1,0x18);
  if (pmVar1 == (multi_files *)0x0) {
    FreeMultiInfo(multi_first,multi_last);
    file_name_local = (char *)0x0;
  }
  else {
    (pmVar1->form).option = CURLFORM_FILE;
    (pmVar1->form).value = file_name;
    AppendNode(multi_first,multi_last,pmVar1);
    if (type_name != (char *)0x0) {
      pmVar1 = (multi_files *)calloc(1,0x18);
      if (pmVar1 == (multi_files *)0x0) {
        FreeMultiInfo(multi_first,multi_last);
        return (multi_files *)0x0;
      }
      (pmVar1->form).option = CURLFORM_CONTENTTYPE;
      (pmVar1->form).value = type_name;
      AppendNode(multi_first,multi_last,pmVar1);
    }
    if (show_filename != (char *)0x0) {
      pmVar1 = (multi_files *)calloc(1,0x18);
      if (pmVar1 == (multi_files *)0x0) {
        FreeMultiInfo(multi_first,multi_last);
        return (multi_files *)0x0;
      }
      (pmVar1->form).option = CURLFORM_FILENAME;
      (pmVar1->form).value = show_filename;
      AppendNode(multi_first,multi_last,pmVar1);
    }
    file_name_local = (char *)*multi_last;
  }
  return (multi_files *)file_name_local;
}

Assistant:

struct multi_files *AddMultiFiles(const char *file_name,
                                  const char *type_name,
                                  const char *show_filename,
                                  struct multi_files **multi_first,
                                  struct multi_files **multi_last)
{
  struct multi_files *multi;
  struct multi_files *multi_type;
  struct multi_files *multi_name;

  multi = calloc(1, sizeof(struct multi_files));
  if(multi) {
    multi->form.option = CURLFORM_FILE;
    multi->form.value = file_name;
    AppendNode(multi_first, multi_last, multi);
  }
  else {
    FreeMultiInfo(multi_first, multi_last);
    return NULL;
  }

  if(type_name) {
    multi_type = calloc(1, sizeof(struct multi_files));
    if(multi_type) {
      multi_type->form.option = CURLFORM_CONTENTTYPE;
      multi_type->form.value = type_name;
      AppendNode(multi_first, multi_last, multi_type);
    }
    else {
      FreeMultiInfo(multi_first, multi_last);
      return NULL;
    }
  }

  if(show_filename) {
    multi_name = calloc(1, sizeof(struct multi_files));
    if(multi_name) {
      multi_name->form.option = CURLFORM_FILENAME;
      multi_name->form.value = show_filename;
      AppendNode(multi_first, multi_last, multi_name);
    }
    else {
      FreeMultiInfo(multi_first, multi_last);
      return NULL;
    }
  }

  return *multi_last;
}